

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O0

void __thiscall OpenMD::OpenMDBitSet::resize(OpenMDBitSet *this,size_t nbits)

{
  _Bit_iterator __last;
  _Bit_iterator __first;
  size_t sVar1;
  _Bit_type *p_Var2;
  uint uVar3;
  ulong in_RSI;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  iterator iVar4;
  iterator iVar5;
  bool in_stack_00000017;
  size_type in_stack_00000018;
  vector<bool,_std::allocator<bool>_> *in_stack_00000020;
  size_t oldSize;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb4;
  
  sVar1 = size((OpenMDBitSet *)0x1a6095);
  std::vector<bool,_std::allocator<bool>_>::resize
            (in_stack_00000020,in_stack_00000018,in_stack_00000017);
  if (sVar1 < in_RSI) {
    std::vector<bool,_std::allocator<bool>_>::begin((vector<bool,_std::allocator<bool>_> *)0x1a60c3)
    ;
    iVar4 = std::operator+((iterator *)in_RDI,0x1a60ed);
    p_Var2 = iVar4.super__Bit_iterator_base._M_p;
    uVar3 = iVar4.super__Bit_iterator_base._M_offset;
    iVar5 = std::vector<bool,_std::allocator<bool>_>::end(in_RDI);
    __first.super__Bit_iterator_base._M_offset = uVar3;
    __first.super__Bit_iterator_base._M_p = p_Var2;
    __first.super__Bit_iterator_base._12_4_ = in_stack_ffffffffffffffb4;
    __last.super__Bit_iterator_base._12_4_ = in_stack_ffffffffffffffa4;
    __last.super__Bit_iterator_base._M_p =
         (_Bit_type *)SUB128(iVar5.super__Bit_iterator_base._0_12_,0);
    __last.super__Bit_iterator_base._M_offset = SUB124(iVar5.super__Bit_iterator_base._0_12_,8);
    std::fill<std::_Bit_iterator,bool>
              (__first,__last,
               (bool *)CONCAT44(in_stack_ffffffffffffff94,iVar5.super__Bit_iterator_base._M_offset))
    ;
  }
  return;
}

Assistant:

void OpenMDBitSet::resize(size_t nbits) {
    size_t oldSize = size();
    bitset_.resize(nbits);
    if (nbits > oldSize) {
      std::fill(bitset_.begin() + oldSize, bitset_.end(), false);
    }
  }